

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O1

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
* __thiscall
chaiscript::dispatch::functor<std::__cxx11::string(chaiscript::Boxed_Value_const&)>
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,dispatch *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Type_Conversions_State *t_conversions)

{
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *psVar1;
  __normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  _Var2;
  undefined8 *puVar3;
  Type_Conversions_State *in_R8;
  
  psVar1 = *(shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> **)(this + 8);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,__gnu_cxx::__ops::_Iter_pred<chaiscript::dispatch::functor<std::__cxx11::string(chaiscript::Boxed_Value_const&)>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>const&,chaiscript::Type_Conversions_State_const*)::_lambda(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>>
                    (*(undefined8 *)this);
  if (_Var2._M_current != psVar1) {
    detail::build_function_caller_helper<std::__cxx11::string,chaiscript::Boxed_Value_const&>
              (__return_storage_ptr__,(detail *)0x0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr
                *)this,funcs,in_R8);
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x38);
  *puVar3 = &PTR__bad_cast_005a4ab0;
  puVar3[1] = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  puVar3[2] = &Proxy_Function_Base::typeinfo;
  *(undefined4 *)(puVar3 + 3) = 1;
  puVar3[4] = &std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>::typeinfo;
  puVar3[5] = 0x19;
  puVar3[6] = "Cannot perform boxed_cast";
  __cxa_throw(puVar3,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::function<FunctionType> functor(const std::vector<Const_Proxy_Function> &funcs, const Type_Conversions_State *t_conversions) {
      const bool has_arity_match = std::any_of(funcs.begin(), funcs.end(), [](const Const_Proxy_Function &f) {
        return f->get_arity() == -1 || size_t(f->get_arity()) == detail::arity(static_cast<FunctionType *>(nullptr));
      });

      if (!has_arity_match) {
        throw exception::bad_boxed_cast(user_type<Const_Proxy_Function>(), typeid(std::function<FunctionType>));
      }

      FunctionType *p = nullptr;
      return detail::build_function_caller_helper(p, funcs, t_conversions);
    }